

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_6c37a::CommandLineParser::ParseCommandLineOptions
          (CommandLineParser *this,int argc,char **argv,StringRef Overview,raw_ostream *Errs)

{
  char *pcVar1;
  Option **__s;
  StringMapEntryBase **ppSVar2;
  Option *pOVar3;
  StringRef Value_00;
  StringRef ArgName_00;
  StringRef SVar4;
  bool bVar5;
  StringMap<llvm::cl::Option_*,_llvm::MallocAllocator> *this_00;
  SmallVector<llvm::cl::Option_*,_4U> *pSVar6;
  bool bVar7;
  char cVar8;
  int argc_00;
  FormattingFlags FVar9;
  uint uVar10;
  NumOccurrencesFlag NVar11;
  int iVar12;
  size_t sVar13;
  SubCommand *pSVar14;
  SubCommand *pSVar15;
  CommandLineParser *pCVar16;
  size_t sVar17;
  raw_ostream *prVar18;
  unsigned_long *puVar19;
  ulong uVar20;
  size_t sVar21;
  iterator ppOVar22;
  ulong in_stack_fffffffffffff3a8;
  size_t local_aa0;
  char *local_a50;
  char *local_a10;
  size_t local_a00;
  size_t local_9f0;
  bool local_9b1;
  TokenizerCallback local_940;
  int local_92c;
  undefined1 auStack_928 [4];
  int i_3;
  Twine local_918;
  StringMapEntry<llvm::cl::Option_*> *local_900;
  StringMapEntry<llvm::cl::Option_*> *Opt_1;
  iterator __end1;
  iterator __begin1;
  StringMap<llvm::cl::Option_*,_llvm::MallocAllocator> *__range1;
  size_t e_2;
  size_t j;
  uint ValNo_1;
  bool Done;
  size_t e_1;
  size_t i_2;
  uint NumVals;
  uint ValNo;
  Twine local_838;
  char *local_820;
  char *local_810;
  size_t local_808;
  iterator local_800;
  iterator E;
  iterator I;
  char *local_7e8;
  iterator local_7d0;
  StringRef local_7c0;
  iterator local_7a0;
  StringRef local_790;
  pair<llvm::StringRef,_int> local_780;
  pair<llvm::StringRef,_unsigned_int> local_768;
  StringRef local_750;
  pair<llvm::StringRef,_int> local_740;
  pair<llvm::StringRef,_unsigned_int> local_728;
  int local_70c;
  StringRef local_708;
  undefined1 local_6f8 [8];
  StringRef ArgName;
  StringRef Value;
  string NearestHandlerString;
  Option *NearestHandler;
  Option *Handler;
  int i_1;
  bool DashDashFound;
  Option *ActivePositionalArg;
  SmallVector<std::pair<llvm::StringRef,_unsigned_int>,_4U> PositionalVals;
  StringRef local_618;
  Twine local_608;
  StringRef local_5f0;
  Twine local_5e0;
  Option *local_5c8;
  Option *Opt;
  size_t e;
  size_t i;
  StringMap<llvm::cl::Option_*,_llvm::MallocAllocator> *pSStack_5a8;
  bool UnboundedFound;
  StringMap<llvm::cl::Option_*,_llvm::MallocAllocator> *OptionsMap;
  SmallVector<llvm::cl::Option_*,_4U> *SinkOpts;
  SmallVector<llvm::cl::Option_*,_4U> *PositionalOpts;
  Option **ConsumeAfterOpt;
  SubCommand *local_578;
  SubCommand *ChosenSubCommand;
  int FirstArg;
  bool local_562;
  bool HasUnlimitedPositionals;
  uint NumPositionalRequired;
  bool ErrorParsing;
  bool IgnoreErrors;
  StringRef local_550;
  string local_540;
  string local_520;
  Twine local_500;
  Triple local_4e8;
  StringSaver local_4b0;
  StringSaver Saver;
  BumpPtrAllocator A;
  SmallVector<const_char_*,_20U> newArgv;
  raw_ostream *Errs_local;
  char **argv_local;
  int argc_local;
  CommandLineParser *this_local;
  StringRef Overview_local;
  unsigned_long local_260 [3];
  undefined1 *local_248;
  undefined1 local_240 [16];
  char *local_230;
  iterator local_228;
  undefined1 *local_220;
  unsigned_long local_218 [3];
  undefined1 *local_200;
  undefined1 local_1f8 [16];
  char *local_1e8;
  iterator local_1e0;
  undefined1 *local_1d8;
  long local_1d0;
  SmallVector<llvm::cl::Option_*,_4U> *local_1c8;
  SmallVector<llvm::cl::Option_*,_4U> *local_1c0;
  size_t local_1b8;
  SmallVector<llvm::cl::Option_*,_4U> *local_1b0;
  SmallVector<llvm::cl::Option_*,_4U> *local_1a8;
  size_t local_1a0;
  SmallVector<llvm::cl::Option_*,_4U> *local_198;
  SmallVector<llvm::cl::Option_*,_4U> *local_190;
  size_t local_188;
  SmallVector<llvm::cl::Option_*,_4U> *local_180;
  SmallVector<llvm::cl::Option_*,_4U> *local_178;
  size_t local_170;
  SmallVector<llvm::cl::Option_*,_4U> *local_168;
  SmallVector<llvm::cl::Option_*,_4U> *local_160;
  size_t local_158;
  SmallVector<llvm::cl::Option_*,_4U> *local_150;
  SmallVector<llvm::cl::Option_*,_4U> *local_148;
  size_t local_140;
  SmallVector<llvm::cl::Option_*,_4U> *local_138;
  SmallVector<llvm::cl::Option_*,_4U> *local_130;
  size_t local_128;
  SmallVector<llvm::cl::Option_*,_4U> *local_120;
  SmallVector<llvm::cl::Option_*,_4U> *local_118;
  size_t local_110;
  SmallVector<llvm::cl::Option_*,_4U> *local_108;
  SmallVector<llvm::cl::Option_*,_4U> *local_100;
  ulong local_f8;
  SmallVectorBase *local_f0;
  ulong local_e8;
  SmallVectorBase *local_e0;
  long local_d8;
  SmallVectorBase *local_d0;
  long local_c8;
  SmallVectorBase *local_c0;
  ulong local_b8;
  SmallVectorBase *local_b0;
  ulong local_a8;
  SmallVectorBase *local_a0;
  ulong local_98;
  SmallVectorBase *local_90;
  ulong local_88;
  SmallVectorBase *local_80;
  ulong local_78;
  SmallVectorBase *local_70;
  ulong local_68;
  SmallVectorBase *local_60;
  SmallVectorBase *local_58;
  SmallVectorBase *local_50;
  SmallVectorBase *local_48;
  SmallVectorBase *local_40;
  SmallVectorBase *local_38;
  SmallVectorBase *local_30;
  SmallVectorBase *local_28;
  SmallVectorBase *local_20;
  SmallVectorBase *local_18;
  SmallVectorBase *local_10;
  
  bVar7 = hasOptions(this);
  if (!bVar7) {
    __assert_fail("hasOptions() && \"No options specified!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/CommandLine.cpp"
                  ,0x436,
                  "bool (anonymous namespace)::CommandLineParser::ParseCommandLineOptions(int, const char *const *, StringRef, raw_ostream *)"
                 );
  }
  llvm::SmallVector<char_const*,20u>::SmallVector<char_const*const*,void>
            ((SmallVector<char_const*,20u> *)&A.field_0x60,argv,argv + argc);
  llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::BumpPtrAllocatorImpl
            ((BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL> *)&Saver);
  llvm::StringSaver::StringSaver(&local_4b0,(BumpPtrAllocator *)&Saver);
  llvm::sys::getProcessTriple_abi_cxx11_();
  llvm::Twine::Twine(&local_500,&local_520);
  llvm::Triple::Triple(&local_4e8,&local_500);
  bVar7 = llvm::Triple::isOSWindows(&local_4e8);
  if (bVar7) {
    local_940 = llvm::cl::TokenizeWindowsCommandLine;
  }
  else {
    local_940 = llvm::cl::TokenizeGNUCommandLine;
  }
  llvm::cl::ExpandResponseFiles
            (&local_4b0,local_940,(SmallVectorImpl<const_char_*> *)&A.field_0x60,false,false);
  llvm::Triple::~Triple(&local_4e8);
  std::__cxx11::string::~string((string *)&local_520);
  sVar13 = llvm::SmallVectorBase::size((SmallVectorBase *)&A.field_0x60);
  if (sVar13 == 0) {
    __assert_fail("idx < size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                  ,0x9b,
                  "reference llvm::SmallVectorTemplateCommon<const char *>::operator[](size_type) [T = const char *]"
                 );
  }
  sVar13 = llvm::SmallVectorBase::size((SmallVectorBase *)&A.field_0x60);
  argc_00 = (int)sVar13;
  pcVar1 = *(char **)A._96_8_;
  _NumPositionalRequired = pcVar1;
  if (pcVar1 != (char *)0x0) {
    strlen(pcVar1);
  }
  local_550 = llvm::sys::path::filename(_NumPositionalRequired,native);
  llvm::StringRef::operator_cast_to_string(&local_540,&local_550);
  std::__cxx11::string::operator=((string *)this,(string *)&local_540);
  std::__cxx11::string::~string((string *)&local_540);
  (this->ProgramOverview).Data = Overview.Data;
  (this->ProgramOverview).Length = Overview.Length;
  HasUnlimitedPositionals = Errs != (raw_ostream *)0x0;
  newArgv.super_SmallVectorStorage<const_char_*,_20U>.InlineElts[0x13].
  super_AlignedCharArray<8UL,_8UL>.buffer =
       (AlignedCharArray<8UL,_8UL>)(AlignedCharArray<8UL,_8UL>)Errs;
  if (Errs == (raw_ostream *)0x0) {
    newArgv.super_SmallVectorStorage<const_char_*,_20U>.InlineElts[0x13].
    super_AlignedCharArray<8UL,_8UL>.buffer = (AlignedCharArray<8UL,_8UL>)llvm::errs();
  }
  local_562 = false;
  FirstArg = 0;
  ChosenSubCommand._7_1_ = 0;
  ChosenSubCommand._0_4_ = 1;
  local_578 = llvm::
              ManagedStatic<llvm::cl::SubCommand,_llvm::object_creator<llvm::cl::SubCommand>,_llvm::object_deleter<llvm::cl::SubCommand>_>
              ::operator*((ManagedStatic<llvm::cl::SubCommand,_llvm::object_creator<llvm::cl::SubCommand>,_llvm::object_deleter<llvm::cl::SubCommand>_>
                           *)llvm::cl::TopLevelSubCommand);
  if ((1 < argc_00) && (**(char **)(A._96_8_ + (long)(int)(uint)ChosenSubCommand * 8) != '-')) {
    __s = *(Option ***)(A._96_8_ + (long)(int)(uint)ChosenSubCommand * 8);
    ConsumeAfterOpt = __s;
    if (__s != (Option **)0x0) {
      strlen((char *)__s);
    }
    pSVar14 = LookupSubCommand(this,_ConsumeAfterOpt);
    local_578 = pSVar14;
    pSVar15 = llvm::
              ManagedStatic<llvm::cl::SubCommand,_llvm::object_creator<llvm::cl::SubCommand>,_llvm::object_deleter<llvm::cl::SubCommand>_>
              ::operator*((ManagedStatic<llvm::cl::SubCommand,_llvm::object_creator<llvm::cl::SubCommand>,_llvm::object_deleter<llvm::cl::SubCommand>_>
                           *)llvm::cl::TopLevelSubCommand);
    if (pSVar14 != pSVar15) {
      ChosenSubCommand._0_4_ = 2;
    }
  }
  pSVar14 = local_578;
  pCVar16 = llvm::
            ManagedStatic<(anonymous_namespace)::CommandLineParser,_llvm::object_creator<(anonymous_namespace)::CommandLineParser>,_llvm::object_deleter<(anonymous_namespace)::CommandLineParser>_>
            ::operator->(&GlobalParser);
  pCVar16->ActiveSubCommand = pSVar14;
  if (local_578 == (SubCommand *)0x0) {
    __assert_fail("ChosenSubCommand",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/CommandLine.cpp"
                  ,0x45d,
                  "bool (anonymous namespace)::CommandLineParser::ParseCommandLineOptions(int, const char *const *, StringRef, raw_ostream *)"
                 );
  }
  PositionalOpts = (SmallVector<llvm::cl::Option_*,_4U> *)&local_578->ConsumeAfterOpt;
  SinkOpts = &local_578->PositionalOpts;
  OptionsMap = (StringMap<llvm::cl::Option_*,_llvm::MallocAllocator> *)&local_578->SinkOpts;
  pSStack_5a8 = &local_578->OptionsMap;
  if ((*(Option **)PositionalOpts != (Option *)0x0) &&
     (sVar13 = llvm::SmallVectorBase::size((SmallVectorBase *)SinkOpts), sVar13 == 0)) {
    __assert_fail("PositionalOpts.size() > 0 && \"Cannot specify cl::ConsumeAfter without a positional argument!\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/CommandLine.cpp"
                  ,0x465,
                  "bool (anonymous namespace)::CommandLineParser::ParseCommandLineOptions(int, const char *const *, StringRef, raw_ostream *)"
                 );
  }
  bVar7 = llvm::SmallVectorBase::empty((SmallVectorBase *)SinkOpts);
  if (!bVar7) {
    i._7_1_ = 0;
    e = 0;
    Opt = (Option *)llvm::SmallVectorBase::size((SmallVectorBase *)SinkOpts);
    for (; pSVar6 = SinkOpts, sVar13 = e, (Option *)e != Opt; e = e + 1) {
      local_108 = SinkOpts;
      local_110 = e;
      sVar17 = llvm::SmallVectorBase::size((SmallVectorBase *)SinkOpts);
      if (sVar17 <= sVar13) {
        __assert_fail("idx < size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                      ,0x9b,
                      "reference llvm::SmallVectorTemplateCommon<llvm::cl::Option *>::operator[](size_type) [T = llvm::cl::Option *]"
                     );
      }
      local_100 = pSVar6;
      local_5c8 = *(Option **)
                   ((long)(pSVar6->super_SmallVectorImpl<llvm::cl::Option_*>).
                          super_SmallVectorTemplateBase<llvm::cl::Option_*,_true>.
                          super_SmallVectorTemplateCommon<llvm::cl::Option_*,_void>.
                          super_SmallVectorBase.BeginX + local_110 * 8);
      bVar7 = RequiresValue(local_5c8);
      if (bVar7) {
        FirstArg = FirstArg + 1;
      }
      else if ((PositionalOpts->super_SmallVectorImpl<llvm::cl::Option_*>).
               super_SmallVectorTemplateBase<llvm::cl::Option_*,_true>.
               super_SmallVectorTemplateCommon<llvm::cl::Option_*,_void>.super_SmallVectorBase.
               BeginX == (void *)0x0) {
        if (((i._7_1_ & 1) != 0) &&
           (bVar7 = llvm::cl::Option::hasArgStr(local_5c8), pOVar3 = local_5c8, !bVar7)) {
          if ((HasUnlimitedPositionals & 1U) == 0) {
            llvm::Twine::Twine(&local_608,
                               "error - option can never match, because another positional argument will match an unbounded number of values, and this option does not require a value!"
                              );
            memset(&local_618,0,0x10);
            llvm::StringRef::StringRef(&local_618);
            prVar18 = llvm::errs();
            llvm::cl::Option::error(pOVar3,&local_608,local_618,prVar18);
          }
          prVar18 = llvm::raw_ostream::operator<<
                              ((raw_ostream *)
                               newArgv.super_SmallVectorStorage<const_char_*,_20U>.InlineElts[0x13].
                               super_AlignedCharArray<8UL,_8UL>.buffer,&this->ProgramName);
          prVar18 = llvm::raw_ostream::operator<<(prVar18,": CommandLine Error: Option \'");
          PositionalVals.super_SmallVectorStorage<std::pair<llvm::StringRef,_unsigned_int>,_4U>.
          InlineElts[3].super_AlignedCharArray<8UL,_24UL>.buffer._16_8_ = (local_5c8->ArgStr).Data;
          prVar18 = llvm::raw_ostream::operator<<(prVar18,local_5c8->ArgStr);
          llvm::raw_ostream::operator<<(prVar18,"\' is all messed up!\n");
          sVar13 = llvm::SmallVectorBase::size((SmallVectorBase *)SinkOpts);
          llvm::raw_ostream::operator<<
                    ((raw_ostream *)
                     newArgv.super_SmallVectorStorage<const_char_*,_20U>.InlineElts[0x13].
                     super_AlignedCharArray<8UL,_8UL>.buffer,sVar13);
          local_562 = true;
        }
      }
      else {
        sVar13 = llvm::SmallVectorBase::size((SmallVectorBase *)SinkOpts);
        pOVar3 = local_5c8;
        if (1 < sVar13) {
          if ((HasUnlimitedPositionals & 1U) == 0) {
            llvm::Twine::Twine(&local_5e0,
                               "error - this positional option will never be matched, because it does not Require a value, and a cl::ConsumeAfter option is active!"
                              );
            memset(&local_5f0,0,0x10);
            llvm::StringRef::StringRef(&local_5f0);
            prVar18 = llvm::errs();
            llvm::cl::Option::error(pOVar3,&local_5e0,local_5f0,prVar18);
          }
          local_562 = true;
        }
      }
      bVar7 = EatsUnboundedNumberOfValues(local_5c8);
      i._7_1_ = (i._7_1_ & 1) != 0 || bVar7;
    }
    local_9b1 = true;
    if ((i._7_1_ & 1) == 0) {
      local_9b1 = (PositionalOpts->super_SmallVectorImpl<llvm::cl::Option_*>).
                  super_SmallVectorTemplateBase<llvm::cl::Option_*,_true>.
                  super_SmallVectorTemplateCommon<llvm::cl::Option_*,_void>.super_SmallVectorBase.
                  BeginX != (void *)0x0;
    }
    ChosenSubCommand._7_1_ = local_9b1;
  }
  llvm::SmallVector<std::pair<llvm::StringRef,_unsigned_int>,_4U>::SmallVector
            ((SmallVector<std::pair<llvm::StringRef,_unsigned_int>,_4U> *)&ActivePositionalArg);
  _i_1 = (Option *)0x0;
  Handler._7_1_ = 0;
  for (Handler._0_4_ = (uint)ChosenSubCommand; (int)(uint)Handler < argc_00;
      Handler._0_4_ = (uint)Handler + 1) {
    NearestHandler = (Option *)0x0;
    NearestHandlerString.field_2._8_8_ = 0;
    std::__cxx11::string::string((string *)&Value.Length);
    llvm::StringRef::StringRef((StringRef *)&ArgName.Length);
    local_6f8 = (undefined1  [8])0x374aba;
    ArgName.Data = (char *)strlen("");
    pOVar3 = _i_1;
    if (((**(char **)(A._96_8_ + (long)(int)(uint)Handler * 8) == '-') &&
        (*(char *)(*(long *)(A._96_8_ + (long)(int)(uint)Handler * 8) + 1) != '\0')) &&
       ((Handler._7_1_ & 1) == 0)) {
      if (((**(char **)(A._96_8_ + (long)(int)(uint)Handler * 8) == '-') &&
          (*(char *)(*(long *)(A._96_8_ + (long)(int)(uint)Handler * 8) + 1) == '-')) &&
         ((*(char *)(*(long *)(A._96_8_ + (long)(int)(uint)Handler * 8) + 2) == '\0' &&
          ((Handler._7_1_ & 1) == 0)))) {
        Handler._7_1_ = 1;
        local_70c = 7;
      }
      else {
        if ((_i_1 == (Option *)0x0) ||
           (uVar10 = llvm::cl::Option::getMiscFlags(_i_1), (uVar10 & 2) == 0)) {
          local_7d0 = (iterator)(*(long *)(A._96_8_ + (long)(int)(uint)Handler * 8) + 1);
          if (local_7d0 == (iterator)0x0) {
            local_a50 = (char *)0x0;
          }
          else {
            local_a50 = (char *)strlen((char *)local_7d0);
          }
          local_6f8 = (undefined1  [8])local_7d0;
          ArgName.Data = local_a50;
          while( true ) {
            bVar7 = false;
            if (ArgName.Data != (char *)0x0) {
              cVar8 = llvm::StringRef::operator[]((StringRef *)local_6f8,0);
              bVar7 = cVar8 == '-';
            }
            if (!bVar7) break;
            local_248 = local_6f8;
            local_260[2] = 1;
            local_260[1] = 0xffffffffffffffff;
            puVar19 = std::min<unsigned_long>(local_260 + 2,(unsigned_long *)&ArgName);
            local_260[2] = *puVar19;
            ppOVar22 = (iterator)((long)local_6f8 + local_260[2]);
            local_260[0] = (long)ArgName.Data - local_260[2];
            puVar19 = std::min<unsigned_long>(local_260 + 1,local_260);
            ArgName.Data = (char *)*puVar19;
            local_220 = local_240;
            local_6f8 = (undefined1  [8])ppOVar22;
            local_230 = ArgName.Data;
            local_228 = ppOVar22;
          }
          NearestHandler =
               LookupOption(this,local_578,(StringRef *)local_6f8,(StringRef *)&ArgName.Length);
          if (NearestHandler == (Option *)0x0) {
            NearestHandler =
                 HandlePrefixedOrGroupedOption
                           ((StringRef *)local_6f8,(StringRef *)&ArgName.Length,&local_562,
                            pSStack_5a8);
          }
          if ((NearestHandler == (Option *)0x0) &&
             (bVar7 = llvm::SmallVectorBase::empty((SmallVectorBase *)OptionsMap), bVar7)) {
            I = (iterator)local_6f8;
            local_7e8 = ArgName.Data;
            SVar4.Length = (size_t)ArgName.Data;
            SVar4.Data = (char *)local_6f8;
            NearestHandlerString.field_2._8_8_ =
                 LookupNearestOption(SVar4,pSStack_5a8,(string *)&Value.Length);
          }
        }
        else {
          local_7a0 = (iterator)(*(long *)(A._96_8_ + (long)(int)(uint)Handler * 8) + 1);
          if (local_7a0 == (iterator)0x0) {
            local_a10 = (char *)0x0;
          }
          else {
            local_a10 = (char *)strlen((char *)local_7a0);
          }
          local_6f8 = (undefined1  [8])local_7a0;
          ArgName.Data = local_a10;
          while( true ) {
            bVar7 = false;
            if (ArgName.Data != (char *)0x0) {
              cVar8 = llvm::StringRef::operator[]((StringRef *)local_6f8,0);
              bVar7 = cVar8 == '-';
            }
            if (!bVar7) break;
            local_200 = local_6f8;
            local_218[2] = 1;
            local_218[1] = 0xffffffffffffffff;
            puVar19 = std::min<unsigned_long>(local_218 + 2,(unsigned_long *)&ArgName);
            local_218[2] = *puVar19;
            ppOVar22 = (iterator)((long)local_6f8 + local_218[2]);
            local_218[0] = (long)ArgName.Data - local_218[2];
            puVar19 = std::min<unsigned_long>(local_218 + 1,local_218);
            ArgName.Data = (char *)*puVar19;
            local_1d8 = local_1f8;
            local_6f8 = (undefined1  [8])ppOVar22;
            local_1e8 = ArgName.Data;
            local_1e0 = ppOVar22;
          }
          NearestHandler =
               LookupOption(this,local_578,(StringRef *)local_6f8,(StringRef *)&ArgName.Length);
          if ((NearestHandler == (Option *)0x0) ||
             (FVar9 = llvm::cl::Option::getFormattingFlag(NearestHandler), FVar9 != Positional)) {
            pOVar3 = _i_1;
            pcVar1 = *(char **)(A._96_8_ + (long)(int)(uint)Handler * 8);
            local_7c0.Data = pcVar1;
            if (pcVar1 != (char *)0x0) {
              strlen(pcVar1);
            }
            ProvidePositionalOption(pOVar3,local_7c0,(uint)Handler);
            local_70c = 7;
            goto LAB_0015b0fc;
          }
        }
LAB_0015ace9:
        if (NearestHandler == (Option *)0x0) {
          bVar7 = llvm::SmallVectorBase::empty((SmallVectorBase *)OptionsMap);
          if (bVar7) {
            prVar18 = llvm::raw_ostream::operator<<
                                ((raw_ostream *)
                                 newArgv.super_SmallVectorStorage<const_char_*,_20U>.InlineElts
                                 [0x13].super_AlignedCharArray<8UL,_8UL>.buffer,&this->ProgramName);
            prVar18 = llvm::raw_ostream::operator<<(prVar18,": Unknown command line argument \'");
            prVar18 = llvm::raw_ostream::operator<<
                                (prVar18,*(char **)(A._96_8_ + (long)(int)(uint)Handler * 8));
            prVar18 = llvm::raw_ostream::operator<<(prVar18,"\'.  Try: \'");
            prVar18 = llvm::raw_ostream::operator<<(prVar18,*(char **)A._96_8_);
            llvm::raw_ostream::operator<<(prVar18," -help\'\n");
            if (NearestHandlerString.field_2._8_8_ != 0) {
              prVar18 = llvm::raw_ostream::operator<<
                                  ((raw_ostream *)
                                   newArgv.super_SmallVectorStorage<const_char_*,_20U>.InlineElts
                                   [0x13].super_AlignedCharArray<8UL,_8UL>.buffer,&this->ProgramName
                                  );
              prVar18 = llvm::raw_ostream::operator<<(prVar18,": Did you mean \'-");
              prVar18 = llvm::raw_ostream::operator<<(prVar18,(string *)&Value.Length);
              llvm::raw_ostream::operator<<(prVar18,"\'?\n");
            }
            local_562 = true;
          }
          else {
            E = (iterator)(OptionsMap->super_StringMapImpl).TheTable;
            ppSVar2 = (OptionsMap->super_StringMapImpl).TheTable;
            sVar13 = llvm::SmallVectorBase::size((SmallVectorBase *)OptionsMap);
            local_800 = (iterator)(ppSVar2 + sVar13);
            for (; uVar10 = (uint)Handler, E != local_800; E = E + 1) {
              pOVar3 = *E;
              local_810 = "";
              local_808 = strlen("");
              local_820 = *(char **)(A._96_8_ + (long)(int)(uint)Handler * 8);
              if (local_820 == (char *)0x0) {
                local_aa0 = 0;
              }
              else {
                local_aa0 = strlen(local_820);
              }
              in_stack_fffffffffffff3a8 = in_stack_fffffffffffff3a8 & 0xffffffff00000000;
              (*pOVar3->_vptr_Option[10])
                        (pOVar3,(ulong)uVar10,local_810,local_808,local_820,local_aa0,
                         in_stack_fffffffffffff3a8);
            }
          }
          local_70c = 7;
        }
        else {
          FVar9 = llvm::cl::Option::getFormattingFlag(NearestHandler);
          if (FVar9 == Positional) {
            uVar10 = llvm::cl::Option::getMiscFlags(NearestHandler);
            if (((uVar10 & 2) != 0) && (Value.Data != (char *)0x0)) {
              llvm::Twine::Twine(&local_838,
                                 "This argument does not take a value.\n\tInstead, it consumes any positional arguments until the next recognized option."
                                );
              llvm::cl::Option::error
                        (NearestHandler,&local_838,
                         (raw_ostream *)
                         newArgv.super_SmallVectorStorage<const_char_*,_20U>.InlineElts[0x13].
                         super_AlignedCharArray<8UL,_8UL>.buffer);
              local_562 = true;
            }
            _i_1 = NearestHandler;
          }
          else {
            ArgName_00.Length = (size_t)ArgName.Data;
            ArgName_00.Data = (char *)local_6f8;
            Value_00.Length = (size_t)Value.Data;
            Value_00.Data = (char *)ArgName.Length;
            in_stack_fffffffffffff3a8 = A._96_8_;
            bVar7 = ProvideOption(NearestHandler,ArgName_00,Value_00,argc_00,(char **)A._96_8_,
                                  (int *)&Handler);
            local_562 = (local_562 & 1U) != 0 || bVar7;
          }
          local_70c = 0;
        }
      }
    }
    else if (_i_1 == (Option *)0x0) {
      bVar7 = llvm::SmallVectorBase::empty((SmallVectorBase *)SinkOpts);
      if (bVar7) goto LAB_0015ace9;
      local_750.Data = *(char **)(A._96_8_ + (long)(int)(uint)Handler * 8);
      if (local_750.Data == (char *)0x0) {
        local_9f0 = 0;
      }
      else {
        local_9f0 = strlen(local_750.Data);
      }
      local_750.Length = local_9f0;
      std::make_pair<llvm::StringRef,int&>(&local_740,&local_750,(int *)&Handler);
      std::pair<llvm::StringRef,_unsigned_int>::pair<llvm::StringRef,_int,_true>
                (&local_728,&local_740);
      llvm::SmallVectorTemplateBase<std::pair<llvm::StringRef,_unsigned_int>,_true>::push_back
                ((SmallVectorTemplateBase<std::pair<llvm::StringRef,_unsigned_int>,_true> *)
                 &ActivePositionalArg,&local_728);
      sVar13 = llvm::SmallVectorBase::size((SmallVectorBase *)&ActivePositionalArg);
      if ((sVar13 < (uint)FirstArg) ||
         ((PositionalOpts->super_SmallVectorImpl<llvm::cl::Option_*>).
          super_SmallVectorTemplateBase<llvm::cl::Option_*,_true>.
          super_SmallVectorTemplateCommon<llvm::cl::Option_*,_void>.super_SmallVectorBase.BeginX ==
          (void *)0x0)) {
        local_70c = 7;
      }
      else {
        while (Handler._0_4_ = (uint)Handler + 1, (int)(uint)Handler < argc_00) {
          local_790.Data = *(char **)(A._96_8_ + (long)(int)(uint)Handler * 8);
          if (local_790.Data == (char *)0x0) {
            local_a00 = 0;
          }
          else {
            local_a00 = strlen(local_790.Data);
          }
          local_790.Length = local_a00;
          std::make_pair<llvm::StringRef,int&>(&local_780,&local_790,(int *)&Handler);
          std::pair<llvm::StringRef,_unsigned_int>::pair<llvm::StringRef,_int,_true>
                    (&local_768,&local_780);
          llvm::SmallVectorTemplateBase<std::pair<llvm::StringRef,_unsigned_int>,_true>::push_back
                    ((SmallVectorTemplateBase<std::pair<llvm::StringRef,_unsigned_int>,_true> *)
                     &ActivePositionalArg,&local_768);
        }
        local_70c = 5;
      }
    }
    else {
      pcVar1 = *(char **)(A._96_8_ + (long)(int)(uint)Handler * 8);
      local_708.Data = pcVar1;
      if (pcVar1 != (char *)0x0) {
        strlen(pcVar1);
      }
      ProvidePositionalOption(pOVar3,local_708,(uint)Handler);
      local_70c = 7;
    }
LAB_0015b0fc:
    std::__cxx11::string::~string((string *)&Value.Length);
    if ((local_70c != 0) && (local_70c == 5)) break;
  }
  uVar20 = (ulong)(uint)FirstArg;
  sVar13 = llvm::SmallVectorBase::size((SmallVectorBase *)&ActivePositionalArg);
  if (sVar13 < uVar20) {
    prVar18 = llvm::raw_ostream::operator<<
                        ((raw_ostream *)
                         newArgv.super_SmallVectorStorage<const_char_*,_20U>.InlineElts[0x13].
                         super_AlignedCharArray<8UL,_8UL>.buffer,&this->ProgramName);
    prVar18 = llvm::raw_ostream::operator<<
                        (prVar18,": Not enough positional command line arguments specified!\n");
    prVar18 = llvm::raw_ostream::operator<<(prVar18,"Must specify at least ");
    prVar18 = llvm::raw_ostream::operator<<(prVar18,FirstArg);
    prVar18 = llvm::raw_ostream::operator<<(prVar18," positional argument");
    pcVar1 = "\n\r\t";
    if (1 < (uint)FirstArg) {
      pcVar1 = "  %s";
    }
    prVar18 = llvm::raw_ostream::operator<<(prVar18,pcVar1 + 3);
    prVar18 = llvm::raw_ostream::operator<<(prVar18,": See: ");
    prVar18 = llvm::raw_ostream::operator<<(prVar18,*(char **)A._96_8_);
    llvm::raw_ostream::operator<<(prVar18," -help\n");
    local_562 = true;
  }
  else {
    if ((ChosenSubCommand._7_1_ & 1) == 0) {
      sVar13 = llvm::SmallVectorBase::size((SmallVectorBase *)&ActivePositionalArg);
      sVar17 = llvm::SmallVectorBase::size((SmallVectorBase *)SinkOpts);
      if (sVar17 < sVar13) {
        prVar18 = llvm::raw_ostream::operator<<
                            ((raw_ostream *)
                             newArgv.super_SmallVectorStorage<const_char_*,_20U>.InlineElts[0x13].
                             super_AlignedCharArray<8UL,_8UL>.buffer,&this->ProgramName);
        prVar18 = llvm::raw_ostream::operator<<
                            (prVar18,": Too many positional arguments specified!\n");
        prVar18 = llvm::raw_ostream::operator<<(prVar18,"Can specify at most ");
        sVar13 = llvm::SmallVectorBase::size((SmallVectorBase *)SinkOpts);
        prVar18 = llvm::raw_ostream::operator<<(prVar18,sVar13);
        prVar18 = llvm::raw_ostream::operator<<(prVar18," positional arguments: See: ");
        prVar18 = llvm::raw_ostream::operator<<(prVar18,*(char **)A._96_8_);
        llvm::raw_ostream::operator<<(prVar18," -help\n");
        local_562 = true;
        goto LAB_0015c0be;
      }
    }
    if ((PositionalOpts->super_SmallVectorImpl<llvm::cl::Option_*>).
        super_SmallVectorTemplateBase<llvm::cl::Option_*,_true>.
        super_SmallVectorTemplateCommon<llvm::cl::Option_*,_void>.super_SmallVectorBase.BeginX ==
        (void *)0x0) {
      i_2._4_4_ = 0;
      sVar13 = llvm::SmallVectorBase::size((SmallVectorBase *)&ActivePositionalArg);
      e_1 = 0;
      sVar17 = llvm::SmallVectorBase::size((SmallVectorBase *)SinkOpts);
      for (; pSVar6 = SinkOpts, e_1 != sVar17; e_1 = e_1 + 1) {
        local_120 = SinkOpts;
        local_128 = e_1;
        sVar21 = llvm::SmallVectorBase::size((SmallVectorBase *)SinkOpts);
        if (sVar21 <= e_1) {
          __assert_fail("idx < size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                        ,0x9b,
                        "reference llvm::SmallVectorTemplateCommon<llvm::cl::Option *>::operator[](size_type) [T = llvm::cl::Option *]"
                       );
        }
        local_118 = pSVar6;
        bVar7 = RequiresValue(*(Option **)
                               ((long)(pSVar6->super_SmallVectorImpl<llvm::cl::Option_*>).
                                      super_SmallVectorTemplateBase<llvm::cl::Option_*,_true>.
                                      super_SmallVectorTemplateCommon<llvm::cl::Option_*,_void>.
                                      super_SmallVectorBase.BeginX + local_128 * 8));
        pSVar6 = SinkOpts;
        if (bVar7) {
          local_138 = SinkOpts;
          local_140 = e_1;
          sVar21 = llvm::SmallVectorBase::size((SmallVectorBase *)SinkOpts);
          if (sVar21 <= e_1) {
            __assert_fail("idx < size()",
                          "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                          ,0x9b,
                          "reference llvm::SmallVectorTemplateCommon<llvm::cl::Option *>::operator[](size_type) [T = llvm::cl::Option *]"
                         );
          }
          local_130 = pSVar6;
          pOVar3 = *(Option **)
                    ((long)(pSVar6->super_SmallVectorImpl<llvm::cl::Option_*>).
                           super_SmallVectorTemplateBase<llvm::cl::Option_*,_true>.
                           super_SmallVectorTemplateCommon<llvm::cl::Option_*,_void>.
                           super_SmallVectorBase.BeginX + local_140 * 8);
          local_68 = (ulong)i_2._4_4_;
          local_60 = (SmallVectorBase *)&ActivePositionalArg;
          sVar21 = llvm::SmallVectorBase::size((SmallVectorBase *)&ActivePositionalArg);
          if (sVar21 <= i_2._4_4_) {
            __assert_fail("idx < size()",
                          "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                          ,0x9b,
                          "reference llvm::SmallVectorTemplateCommon<std::pair<llvm::StringRef, unsigned int>>::operator[](size_type) [T = std::pair<llvm::StringRef, unsigned int>]"
                         );
          }
          SVar4 = *(StringRef *)((ActivePositionalArg->Subs).SmallStorage + local_68 * 3 + -0xe);
          local_78 = (ulong)i_2._4_4_;
          local_70 = (SmallVectorBase *)&ActivePositionalArg;
          local_58 = (SmallVectorBase *)&ActivePositionalArg;
          sVar21 = llvm::SmallVectorBase::size((SmallVectorBase *)&ActivePositionalArg);
          if (sVar21 <= i_2._4_4_) {
            __assert_fail("idx < size()",
                          "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                          ,0x9b,
                          "reference llvm::SmallVectorTemplateCommon<std::pair<llvm::StringRef, unsigned int>>::operator[](size_type) [T = std::pair<llvm::StringRef, unsigned int>]"
                         );
          }
          local_50 = (SmallVectorBase *)&ActivePositionalArg;
          ProvidePositionalOption
                    (pOVar3,SVar4,
                     *(uint *)((long)(&ActivePositionalArg->Subs + -1) + local_78 * 6 * 4));
          i_2._4_4_ = i_2._4_4_ + 1;
          FirstArg = FirstArg + -1;
        }
        pSVar6 = SinkOpts;
        local_150 = SinkOpts;
        local_158 = e_1;
        sVar21 = llvm::SmallVectorBase::size((SmallVectorBase *)SinkOpts);
        if (sVar21 <= e_1) {
          __assert_fail("idx < size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                        ,0x9b,
                        "reference llvm::SmallVectorTemplateCommon<llvm::cl::Option *>::operator[](size_type) [T = llvm::cl::Option *]"
                       );
        }
        local_148 = pSVar6;
        NVar11 = llvm::cl::Option::getNumOccurrencesFlag
                           (*(Option **)
                             ((long)(pSVar6->super_SmallVectorImpl<llvm::cl::Option_*>).
                                    super_SmallVectorTemplateBase<llvm::cl::Option_*,_true>.
                                    super_SmallVectorTemplateCommon<llvm::cl::Option_*,_void>.
                                    super_SmallVectorBase.BeginX + local_158 * 8));
        bVar7 = NVar11 == Required;
        while( true ) {
          pSVar6 = SinkOpts;
          bVar5 = false;
          if ((uint)FirstArg < (int)sVar13 - i_2._4_4_) {
            bVar5 = (bool)(bVar7 ^ 1);
          }
          if (!bVar5) break;
          local_168 = SinkOpts;
          local_170 = e_1;
          sVar21 = llvm::SmallVectorBase::size((SmallVectorBase *)SinkOpts);
          if (sVar21 <= e_1) {
            __assert_fail("idx < size()",
                          "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                          ,0x9b,
                          "reference llvm::SmallVectorTemplateCommon<llvm::cl::Option *>::operator[](size_type) [T = llvm::cl::Option *]"
                         );
          }
          local_160 = pSVar6;
          NVar11 = llvm::cl::Option::getNumOccurrencesFlag
                             (*(Option **)
                               ((long)(pSVar6->super_SmallVectorImpl<llvm::cl::Option_*>).
                                      super_SmallVectorTemplateBase<llvm::cl::Option_*,_true>.
                                      super_SmallVectorTemplateCommon<llvm::cl::Option_*,_void>.
                                      super_SmallVectorBase.BeginX + local_170 * 8));
          pSVar6 = SinkOpts;
          if (NVar11 == Optional) {
            bVar7 = true;
          }
          else if ((NVar11 != ZeroOrMore) && (NVar11 != OneOrMore)) {
            llvm::llvm_unreachable_internal
                      ("Internal error, unexpected NumOccurrences flag in positional argument processing!"
                       ,
                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/CommandLine.cpp"
                       ,0x534);
          }
          local_180 = SinkOpts;
          local_188 = e_1;
          sVar21 = llvm::SmallVectorBase::size((SmallVectorBase *)SinkOpts);
          if (sVar21 <= e_1) {
            __assert_fail("idx < size()",
                          "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                          ,0x9b,
                          "reference llvm::SmallVectorTemplateCommon<llvm::cl::Option *>::operator[](size_type) [T = llvm::cl::Option *]"
                         );
          }
          local_178 = pSVar6;
          pOVar3 = *(Option **)
                    ((long)(pSVar6->super_SmallVectorImpl<llvm::cl::Option_*>).
                           super_SmallVectorTemplateBase<llvm::cl::Option_*,_true>.
                           super_SmallVectorTemplateCommon<llvm::cl::Option_*,_void>.
                           super_SmallVectorBase.BeginX + local_188 * 8);
          local_88 = (ulong)i_2._4_4_;
          local_80 = (SmallVectorBase *)&ActivePositionalArg;
          sVar21 = llvm::SmallVectorBase::size((SmallVectorBase *)&ActivePositionalArg);
          if (sVar21 <= i_2._4_4_) {
            __assert_fail("idx < size()",
                          "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                          ,0x9b,
                          "reference llvm::SmallVectorTemplateCommon<std::pair<llvm::StringRef, unsigned int>>::operator[](size_type) [T = std::pair<llvm::StringRef, unsigned int>]"
                         );
          }
          SVar4 = *(StringRef *)((ActivePositionalArg->Subs).SmallStorage + local_88 * 3 + -0xe);
          local_98 = (ulong)i_2._4_4_;
          local_90 = (SmallVectorBase *)&ActivePositionalArg;
          local_48 = (SmallVectorBase *)&ActivePositionalArg;
          sVar21 = llvm::SmallVectorBase::size((SmallVectorBase *)&ActivePositionalArg);
          if (sVar21 <= i_2._4_4_) {
            __assert_fail("idx < size()",
                          "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                          ,0x9b,
                          "reference llvm::SmallVectorTemplateCommon<std::pair<llvm::StringRef, unsigned int>>::operator[](size_type) [T = std::pair<llvm::StringRef, unsigned int>]"
                         );
          }
          local_40 = (SmallVectorBase *)&ActivePositionalArg;
          ProvidePositionalOption
                    (pOVar3,SVar4,
                     *(uint *)((long)(&ActivePositionalArg->Subs + -1) + local_98 * 6 * 4));
          i_2._4_4_ = i_2._4_4_ + 1;
        }
      }
    }
    else {
      bVar7 = false;
      if ((PositionalOpts->super_SmallVectorImpl<llvm::cl::Option_*>).
          super_SmallVectorTemplateBase<llvm::cl::Option_*,_true>.
          super_SmallVectorTemplateCommon<llvm::cl::Option_*,_void>.super_SmallVectorBase.BeginX !=
          (void *)0x0) {
        uVar20 = (ulong)(uint)FirstArg;
        sVar13 = llvm::SmallVectorBase::size((SmallVectorBase *)&ActivePositionalArg);
        bVar7 = uVar20 <= sVar13;
      }
      if (!bVar7) {
        __assert_fail("ConsumeAfterOpt && NumPositionalRequired <= PositionalVals.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/CommandLine.cpp"
                      ,0x539,
                      "bool (anonymous namespace)::CommandLineParser::ParseCommandLineOptions(int, const char *const *, StringRef, raw_ostream *)"
                     );
      }
      j._4_4_ = 0;
      e_2 = 1;
      sVar13 = llvm::SmallVectorBase::size((SmallVectorBase *)SinkOpts);
      for (; pSVar6 = SinkOpts, e_2 != sVar13; e_2 = e_2 + 1) {
        local_198 = SinkOpts;
        local_1a0 = e_2;
        sVar17 = llvm::SmallVectorBase::size((SmallVectorBase *)SinkOpts);
        if (sVar17 <= e_2) {
          __assert_fail("idx < size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                        ,0x9b,
                        "reference llvm::SmallVectorTemplateCommon<llvm::cl::Option *>::operator[](size_type) [T = llvm::cl::Option *]"
                       );
        }
        local_190 = pSVar6;
        bVar7 = RequiresValue(*(Option **)
                               ((long)(pSVar6->super_SmallVectorImpl<llvm::cl::Option_*>).
                                      super_SmallVectorTemplateBase<llvm::cl::Option_*,_true>.
                                      super_SmallVectorTemplateCommon<llvm::cl::Option_*,_void>.
                                      super_SmallVectorBase.BeginX + local_1a0 * 8));
        pSVar6 = SinkOpts;
        if (bVar7) {
          local_1b0 = SinkOpts;
          local_1b8 = e_2;
          sVar17 = llvm::SmallVectorBase::size((SmallVectorBase *)SinkOpts);
          if (sVar17 <= e_2) {
            __assert_fail("idx < size()",
                          "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                          ,0x9b,
                          "reference llvm::SmallVectorTemplateCommon<llvm::cl::Option *>::operator[](size_type) [T = llvm::cl::Option *]"
                         );
          }
          local_1a8 = pSVar6;
          pOVar3 = *(Option **)
                    ((long)(pSVar6->super_SmallVectorImpl<llvm::cl::Option_*>).
                           super_SmallVectorTemplateBase<llvm::cl::Option_*,_true>.
                           super_SmallVectorTemplateCommon<llvm::cl::Option_*,_void>.
                           super_SmallVectorBase.BeginX + local_1b8 * 8);
          local_a8 = (ulong)j._4_4_;
          local_a0 = (SmallVectorBase *)&ActivePositionalArg;
          sVar17 = llvm::SmallVectorBase::size((SmallVectorBase *)&ActivePositionalArg);
          if (sVar17 <= j._4_4_) {
            __assert_fail("idx < size()",
                          "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                          ,0x9b,
                          "reference llvm::SmallVectorTemplateCommon<std::pair<llvm::StringRef, unsigned int>>::operator[](size_type) [T = std::pair<llvm::StringRef, unsigned int>]"
                         );
          }
          SVar4 = *(StringRef *)((ActivePositionalArg->Subs).SmallStorage + local_a8 * 3 + -0xe);
          local_b8 = (ulong)j._4_4_;
          local_b0 = (SmallVectorBase *)&ActivePositionalArg;
          local_38 = (SmallVectorBase *)&ActivePositionalArg;
          sVar17 = llvm::SmallVectorBase::size((SmallVectorBase *)&ActivePositionalArg);
          if (sVar17 <= j._4_4_) {
            __assert_fail("idx < size()",
                          "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                          ,0x9b,
                          "reference llvm::SmallVectorTemplateCommon<std::pair<llvm::StringRef, unsigned int>>::operator[](size_type) [T = std::pair<llvm::StringRef, unsigned int>]"
                         );
          }
          local_30 = (SmallVectorBase *)&ActivePositionalArg;
          bVar7 = ProvidePositionalOption
                            (pOVar3,SVar4,
                             *(uint *)((long)(&ActivePositionalArg->Subs + -1) + local_b8 * 6 * 4));
          local_562 = (local_562 & 1U) != 0 || bVar7;
          j._4_4_ = j._4_4_ + 1;
        }
      }
      sVar13 = llvm::SmallVectorBase::size((SmallVectorBase *)SinkOpts);
      if (((sVar13 == 1) && (j._4_4_ == 0)) &&
         (bVar7 = llvm::SmallVectorBase::empty((SmallVectorBase *)&ActivePositionalArg),
         pSVar6 = SinkOpts, !bVar7)) {
        local_1c8 = SinkOpts;
        local_1d0 = 0;
        sVar13 = llvm::SmallVectorBase::size((SmallVectorBase *)SinkOpts);
        if (sVar13 == 0) {
          __assert_fail("idx < size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                        ,0x9b,
                        "reference llvm::SmallVectorTemplateCommon<llvm::cl::Option *>::operator[](size_type) [T = llvm::cl::Option *]"
                       );
        }
        local_1c0 = pSVar6;
        pOVar3 = *(Option **)
                  ((long)(pSVar6->super_SmallVectorImpl<llvm::cl::Option_*>).
                         super_SmallVectorTemplateBase<llvm::cl::Option_*,_true>.
                         super_SmallVectorTemplateCommon<llvm::cl::Option_*,_void>.
                         super_SmallVectorBase.BeginX + local_1d0 * 8);
        local_c8 = 0;
        local_c0 = (SmallVectorBase *)&ActivePositionalArg;
        sVar13 = llvm::SmallVectorBase::size((SmallVectorBase *)&ActivePositionalArg);
        if (sVar13 == 0) {
          __assert_fail("idx < size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                        ,0x9b,
                        "reference llvm::SmallVectorTemplateCommon<std::pair<llvm::StringRef, unsigned int>>::operator[](size_type) [T = std::pair<llvm::StringRef, unsigned int>]"
                       );
        }
        SVar4 = *(StringRef *)((ActivePositionalArg->Subs).SmallStorage + local_c8 * 3 + -0xe);
        local_d8 = 0;
        local_d0 = (SmallVectorBase *)&ActivePositionalArg;
        local_28 = (SmallVectorBase *)&ActivePositionalArg;
        sVar13 = llvm::SmallVectorBase::size((SmallVectorBase *)&ActivePositionalArg);
        if (sVar13 == 0) {
          __assert_fail("idx < size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                        ,0x9b,
                        "reference llvm::SmallVectorTemplateCommon<std::pair<llvm::StringRef, unsigned int>>::operator[](size_type) [T = std::pair<llvm::StringRef, unsigned int>]"
                       );
        }
        local_20 = (SmallVectorBase *)&ActivePositionalArg;
        bVar7 = ProvidePositionalOption
                          (pOVar3,SVar4,
                           *(uint *)((long)(&ActivePositionalArg->Subs + -1) + local_d8 * 6 * 4));
        local_562 = (local_562 & 1U) != 0 || bVar7;
        j._4_4_ = 1;
      }
      for (; sVar13 = llvm::SmallVectorBase::size((SmallVectorBase *)&ActivePositionalArg),
          j._4_4_ != sVar13; j._4_4_ = j._4_4_ + 1) {
        pOVar3 = (Option *)
                 (PositionalOpts->super_SmallVectorImpl<llvm::cl::Option_*>).
                 super_SmallVectorTemplateBase<llvm::cl::Option_*,_true>.
                 super_SmallVectorTemplateCommon<llvm::cl::Option_*,_void>.super_SmallVectorBase.
                 BeginX;
        local_e8 = (ulong)j._4_4_;
        local_e0 = (SmallVectorBase *)&ActivePositionalArg;
        sVar13 = llvm::SmallVectorBase::size((SmallVectorBase *)&ActivePositionalArg);
        if (sVar13 <= j._4_4_) {
          __assert_fail("idx < size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                        ,0x9b,
                        "reference llvm::SmallVectorTemplateCommon<std::pair<llvm::StringRef, unsigned int>>::operator[](size_type) [T = std::pair<llvm::StringRef, unsigned int>]"
                       );
        }
        SVar4 = *(StringRef *)((ActivePositionalArg->Subs).SmallStorage + local_e8 * 3 + -0xe);
        local_f8 = (ulong)j._4_4_;
        local_f0 = (SmallVectorBase *)&ActivePositionalArg;
        local_18 = (SmallVectorBase *)&ActivePositionalArg;
        sVar13 = llvm::SmallVectorBase::size((SmallVectorBase *)&ActivePositionalArg);
        if (sVar13 <= j._4_4_) {
          __assert_fail("idx < size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                        ,0x9b,
                        "reference llvm::SmallVectorTemplateCommon<std::pair<llvm::StringRef, unsigned int>>::operator[](size_type) [T = std::pair<llvm::StringRef, unsigned int>]"
                       );
        }
        local_10 = (SmallVectorBase *)&ActivePositionalArg;
        bVar7 = ProvidePositionalOption
                          (pOVar3,SVar4,
                           *(uint *)((long)(&ActivePositionalArg->Subs + -1) + local_f8 * 6 * 4));
        local_562 = (local_562 & 1U) != 0 || bVar7;
      }
    }
  }
LAB_0015c0be:
  this_00 = pSStack_5a8;
  __end1 = llvm::StringMap<llvm::cl::Option_*,_llvm::MallocAllocator>::begin(pSStack_5a8);
  Opt_1 = (StringMapEntry<llvm::cl::Option_*> *)
          llvm::StringMap<llvm::cl::Option_*,_llvm::MallocAllocator>::end(this_00);
  while (bVar7 = llvm::
                 iterator_facade_base<llvm::StringMapIterator<llvm::cl::Option_*>,_std::forward_iterator_tag,_llvm::StringMapEntry<llvm::cl::Option_*>,_long,_llvm::StringMapEntry<llvm::cl::Option_*>_*,_llvm::StringMapEntry<llvm::cl::Option_*>_&>
                 ::operator!=((iterator_facade_base<llvm::StringMapIterator<llvm::cl::Option_*>,_std::forward_iterator_tag,_llvm::StringMapEntry<llvm::cl::Option_*>,_long,_llvm::StringMapEntry<llvm::cl::Option_*>_*,_llvm::StringMapEntry<llvm::cl::Option_*>_&>
                               *)&__end1,(StringMapIterator<llvm::cl::Option_*> *)&Opt_1), bVar7) {
    local_900 = llvm::StringMapIterator<llvm::cl::Option_*>::operator*(&__end1);
    NVar11 = llvm::cl::Option::getNumOccurrencesFlag(local_900->second);
    if ((NVar11 == Required || NVar11 == OneOrMore) &&
       (iVar12 = llvm::cl::Option::getNumOccurrences(local_900->second), iVar12 == 0)) {
      pOVar3 = local_900->second;
      llvm::Twine::Twine(&local_918,"must be specified at least once!");
      memset(auStack_928,0,0x10);
      llvm::StringRef::StringRef((StringRef *)auStack_928);
      prVar18 = llvm::errs();
      llvm::cl::Option::error(pOVar3,&local_918,_auStack_928,prVar18);
      local_562 = true;
    }
    llvm::
    StringMapIterBase<llvm::StringMapIterator<llvm::cl::Option_*>,_llvm::StringMapEntry<llvm::cl::Option_*>_>
    ::operator++(&__end1.
                  super_StringMapIterBase<llvm::StringMapIterator<llvm::cl::Option_*>,_llvm::StringMapEntry<llvm::cl::Option_*>_>
                );
  }
  if (((llvm::DebugFlag & 1) != 0) && (bVar7 = llvm::isCurrentDebugType("commandline"), bVar7)) {
    prVar18 = llvm::dbgs();
    llvm::raw_ostream::operator<<(prVar18,"Args: ");
    for (local_92c = 0; local_92c < argc_00; local_92c = local_92c + 1) {
      prVar18 = llvm::dbgs();
      prVar18 = llvm::raw_ostream::operator<<(prVar18,*(char **)(A._96_8_ + (long)local_92c * 8));
      llvm::raw_ostream::operator<<(prVar18,' ');
    }
    prVar18 = llvm::dbgs();
    llvm::raw_ostream::operator<<(prVar18,'\n');
  }
  std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::clear(&this->MoreHelp);
  if ((local_562 & 1U) == 0) {
    Overview_local.Length._7_1_ = true;
  }
  else {
    if ((HasUnlimitedPositionals & 1U) == 0) {
      exit(1);
    }
    Overview_local.Length._7_1_ = false;
  }
  local_70c = 1;
  llvm::SmallVector<std::pair<llvm::StringRef,_unsigned_int>,_4U>::~SmallVector
            ((SmallVector<std::pair<llvm::StringRef,_unsigned_int>,_4U> *)&ActivePositionalArg);
  llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::~BumpPtrAllocatorImpl
            ((BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL> *)&Saver);
  llvm::SmallVector<const_char_*,_20U>::~SmallVector
            ((SmallVector<const_char_*,_20U> *)&A.field_0x60);
  return Overview_local.Length._7_1_;
}

Assistant:

bool CommandLineParser::ParseCommandLineOptions(int argc,
                                                const char *const *argv,
                                                StringRef Overview,
                                                raw_ostream *Errs) {
  assert(hasOptions() && "No options specified!");

  // Expand response files.
  SmallVector<const char *, 20> newArgv(argv, argv + argc);
  BumpPtrAllocator A;
  StringSaver Saver(A);
  ExpandResponseFiles(Saver,
         Triple(sys::getProcessTriple()).isOSWindows() ?
         cl::TokenizeWindowsCommandLine : cl::TokenizeGNUCommandLine,
         newArgv);
  argv = &newArgv[0];
  argc = static_cast<int>(newArgv.size());

  // Copy the program name into ProgName, making sure not to overflow it.
  ProgramName = sys::path::filename(StringRef(argv[0]));

  ProgramOverview = Overview;
  bool IgnoreErrors = Errs;
  if (!Errs)
    Errs = &errs();
  bool ErrorParsing = false;

  // Check out the positional arguments to collect information about them.
  unsigned NumPositionalRequired = 0;

  // Determine whether or not there are an unlimited number of positionals
  bool HasUnlimitedPositionals = false;

  int FirstArg = 1;
  SubCommand *ChosenSubCommand = &*TopLevelSubCommand;
  if (argc >= 2 && argv[FirstArg][0] != '-') {
    // If the first argument specifies a valid subcommand, start processing
    // options from the second argument.
    ChosenSubCommand = LookupSubCommand(StringRef(argv[FirstArg]));
    if (ChosenSubCommand != &*TopLevelSubCommand)
      FirstArg = 2;
  }
  GlobalParser->ActiveSubCommand = ChosenSubCommand;

  assert(ChosenSubCommand);
  auto &ConsumeAfterOpt = ChosenSubCommand->ConsumeAfterOpt;
  auto &PositionalOpts = ChosenSubCommand->PositionalOpts;
  auto &SinkOpts = ChosenSubCommand->SinkOpts;
  auto &OptionsMap = ChosenSubCommand->OptionsMap;

  if (ConsumeAfterOpt) {
    assert(PositionalOpts.size() > 0 &&
           "Cannot specify cl::ConsumeAfter without a positional argument!");
  }
  if (!PositionalOpts.empty()) {

    // Calculate how many positional values are _required_.
    bool UnboundedFound = false;
    for (size_t i = 0, e = PositionalOpts.size(); i != e; ++i) {
      Option *Opt = PositionalOpts[i];
      if (RequiresValue(Opt))
        ++NumPositionalRequired;
      else if (ConsumeAfterOpt) {
        // ConsumeAfter cannot be combined with "optional" positional options
        // unless there is only one positional argument...
        if (PositionalOpts.size() > 1) {
          if (!IgnoreErrors)
            Opt->error("error - this positional option will never be matched, "
                       "because it does not Require a value, and a "
                       "cl::ConsumeAfter option is active!");
          ErrorParsing = true;
        }
      } else if (UnboundedFound && !Opt->hasArgStr()) {
        // This option does not "require" a value...  Make sure this option is
        // not specified after an option that eats all extra arguments, or this
        // one will never get any!
        //
        if (!IgnoreErrors)
          Opt->error("error - option can never match, because "
                     "another positional argument will match an "
                     "unbounded number of values, and this option"
                     " does not require a value!");
        *Errs << ProgramName << ": CommandLine Error: Option '" << Opt->ArgStr
              << "' is all messed up!\n";
        *Errs << PositionalOpts.size();
        ErrorParsing = true;
      }
      UnboundedFound |= EatsUnboundedNumberOfValues(Opt);
    }
    HasUnlimitedPositionals = UnboundedFound || ConsumeAfterOpt;
  }

  // PositionalVals - A vector of "positional" arguments we accumulate into
  // the process at the end.
  //
  SmallVector<std::pair<StringRef, unsigned>, 4> PositionalVals;

  // If the program has named positional arguments, and the name has been run
  // across, keep track of which positional argument was named.  Otherwise put
  // the positional args into the PositionalVals list...
  Option *ActivePositionalArg = nullptr;

  // Loop over all of the arguments... processing them.
  bool DashDashFound = false; // Have we read '--'?
  for (int i = FirstArg; i < argc; ++i) {
    Option *Handler = nullptr;
    Option *NearestHandler = nullptr;
    std::string NearestHandlerString;
    StringRef Value;
    StringRef ArgName = "";

    // Check to see if this is a positional argument.  This argument is
    // considered to be positional if it doesn't start with '-', if it is "-"
    // itself, or if we have seen "--" already.
    //
    if (argv[i][0] != '-' || argv[i][1] == 0 || DashDashFound) {
      // Positional argument!
      if (ActivePositionalArg) {
        ProvidePositionalOption(ActivePositionalArg, StringRef(argv[i]), i);
        continue; // We are done!
      }

      if (!PositionalOpts.empty()) {
        PositionalVals.push_back(std::make_pair(StringRef(argv[i]), i));

        // All of the positional arguments have been fulfulled, give the rest to
        // the consume after option... if it's specified...
        //
        if (PositionalVals.size() >= NumPositionalRequired && ConsumeAfterOpt) {
          for (++i; i < argc; ++i)
            PositionalVals.push_back(std::make_pair(StringRef(argv[i]), i));
          break; // Handle outside of the argument processing loop...
        }

        // Delay processing positional arguments until the end...
        continue;
      }
    } else if (argv[i][0] == '-' && argv[i][1] == '-' && argv[i][2] == 0 &&
               !DashDashFound) {
      DashDashFound = true; // This is the mythical "--"?
      continue;             // Don't try to process it as an argument itself.
    } else if (ActivePositionalArg &&
               (ActivePositionalArg->getMiscFlags() & PositionalEatsArgs)) {
      // If there is a positional argument eating options, check to see if this
      // option is another positional argument.  If so, treat it as an argument,
      // otherwise feed it to the eating positional.
      ArgName = StringRef(argv[i] + 1);
      // Eat leading dashes.
      while (!ArgName.empty() && ArgName[0] == '-')
        ArgName = ArgName.substr(1);

      Handler = LookupOption(*ChosenSubCommand, ArgName, Value);
      if (!Handler || Handler->getFormattingFlag() != cl::Positional) {
        ProvidePositionalOption(ActivePositionalArg, StringRef(argv[i]), i);
        continue; // We are done!
      }

    } else { // We start with a '-', must be an argument.
      ArgName = StringRef(argv[i] + 1);
      // Eat leading dashes.
      while (!ArgName.empty() && ArgName[0] == '-')
        ArgName = ArgName.substr(1);

      Handler = LookupOption(*ChosenSubCommand, ArgName, Value);

      // Check to see if this "option" is really a prefixed or grouped argument.
      if (!Handler)
        Handler = HandlePrefixedOrGroupedOption(ArgName, Value, ErrorParsing,
                                                OptionsMap);

      // Otherwise, look for the closest available option to report to the user
      // in the upcoming error.
      if (!Handler && SinkOpts.empty())
        NearestHandler =
            LookupNearestOption(ArgName, OptionsMap, NearestHandlerString);
    }

    if (!Handler) {
      if (SinkOpts.empty()) {
        *Errs << ProgramName << ": Unknown command line argument '" << argv[i]
              << "'.  Try: '" << argv[0] << " -help'\n";

        if (NearestHandler) {
          // If we know a near match, report it as well.
          *Errs << ProgramName << ": Did you mean '-" << NearestHandlerString
                 << "'?\n";
        }

        ErrorParsing = true;
      } else {
        for (SmallVectorImpl<Option *>::iterator I = SinkOpts.begin(),
                                                 E = SinkOpts.end();
             I != E; ++I)
          (*I)->addOccurrence(i, "", StringRef(argv[i]));
      }
      continue;
    }

    // If this is a named positional argument, just remember that it is the
    // active one...
    if (Handler->getFormattingFlag() == cl::Positional) {
      if ((Handler->getMiscFlags() & PositionalEatsArgs) && !Value.empty()) {
        Handler->error("This argument does not take a value.\n"
                       "\tInstead, it consumes any positional arguments until "
                       "the next recognized option.", *Errs);
        ErrorParsing = true;
      }
      ActivePositionalArg = Handler;
    }
    else
      ErrorParsing |= ProvideOption(Handler, ArgName, Value, argc, argv, i);
  }

  // Check and handle positional arguments now...
  if (NumPositionalRequired > PositionalVals.size()) {
      *Errs << ProgramName
             << ": Not enough positional command line arguments specified!\n"
             << "Must specify at least " << NumPositionalRequired
             << " positional argument" << (NumPositionalRequired > 1 ? "s" : "")
             << ": See: " << argv[0] << " -help\n";

    ErrorParsing = true;
  } else if (!HasUnlimitedPositionals &&
             PositionalVals.size() > PositionalOpts.size()) {
    *Errs << ProgramName << ": Too many positional arguments specified!\n"
          << "Can specify at most " << PositionalOpts.size()
          << " positional arguments: See: " << argv[0] << " -help\n";
    ErrorParsing = true;

  } else if (!ConsumeAfterOpt) {
    // Positional args have already been handled if ConsumeAfter is specified.
    unsigned ValNo = 0, NumVals = static_cast<unsigned>(PositionalVals.size());
    for (size_t i = 0, e = PositionalOpts.size(); i != e; ++i) {
      if (RequiresValue(PositionalOpts[i])) {
        ProvidePositionalOption(PositionalOpts[i], PositionalVals[ValNo].first,
                                PositionalVals[ValNo].second);
        ValNo++;
        --NumPositionalRequired; // We fulfilled our duty...
      }

      // If we _can_ give this option more arguments, do so now, as long as we
      // do not give it values that others need.  'Done' controls whether the
      // option even _WANTS_ any more.
      //
      bool Done = PositionalOpts[i]->getNumOccurrencesFlag() == cl::Required;
      while (NumVals - ValNo > NumPositionalRequired && !Done) {
        switch (PositionalOpts[i]->getNumOccurrencesFlag()) {
        case cl::Optional:
          Done = true; // Optional arguments want _at most_ one value
          LLVM_FALLTHROUGH;
        case cl::ZeroOrMore: // Zero or more will take all they can get...
        case cl::OneOrMore:  // One or more will take all they can get...
          ProvidePositionalOption(PositionalOpts[i],
                                  PositionalVals[ValNo].first,
                                  PositionalVals[ValNo].second);
          ValNo++;
          break;
        default:
          llvm_unreachable("Internal error, unexpected NumOccurrences flag in "
                           "positional argument processing!");
        }
      }
    }
  } else {
    assert(ConsumeAfterOpt && NumPositionalRequired <= PositionalVals.size());
    unsigned ValNo = 0;
    for (size_t j = 1, e = PositionalOpts.size(); j != e; ++j)
      if (RequiresValue(PositionalOpts[j])) {
        ErrorParsing |= ProvidePositionalOption(PositionalOpts[j],
                                                PositionalVals[ValNo].first,
                                                PositionalVals[ValNo].second);
        ValNo++;
      }

    // Handle the case where there is just one positional option, and it's
    // optional.  In this case, we want to give JUST THE FIRST option to the
    // positional option and keep the rest for the consume after.  The above
    // loop would have assigned no values to positional options in this case.
    //
    if (PositionalOpts.size() == 1 && ValNo == 0 && !PositionalVals.empty()) {
      ErrorParsing |= ProvidePositionalOption(PositionalOpts[0],
                                              PositionalVals[ValNo].first,
                                              PositionalVals[ValNo].second);
      ValNo++;
    }

    // Handle over all of the rest of the arguments to the
    // cl::ConsumeAfter command line option...
    for (; ValNo != PositionalVals.size(); ++ValNo)
      ErrorParsing |=
          ProvidePositionalOption(ConsumeAfterOpt, PositionalVals[ValNo].first,
                                  PositionalVals[ValNo].second);
  }

  // Loop over args and make sure all required args are specified!
  for (const auto &Opt : OptionsMap) {
    switch (Opt.second->getNumOccurrencesFlag()) {
    case Required:
    case OneOrMore:
      if (Opt.second->getNumOccurrences() == 0) {
        Opt.second->error("must be specified at least once!");
        ErrorParsing = true;
      }
      LLVM_FALLTHROUGH;
    default:
      break;
    }
  }

  // Now that we know if -debug is specified, we can use it.
  // Note that if ReadResponseFiles == true, this must be done before the
  // memory allocated for the expanded command line is free()d below.
  LLVM_DEBUG(dbgs() << "Args: ";
             for (int i = 0; i < argc; ++i) dbgs() << argv[i] << ' ';
             dbgs() << '\n';);

  // Free all of the memory allocated to the map.  Command line options may only
  // be processed once!
  MoreHelp.clear();

  // If we had an error processing our arguments, don't let the program execute
  if (ErrorParsing) {
    if (!IgnoreErrors)
      exit(1);
    return false;
  }
  return true;
}